

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::RenderPerformanceTestBase::init
          (RenderPerformanceTestBase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  ProgramSources *pPVar6;
  TestLog *log;
  TestError *pTVar7;
  allocator<char> local_209;
  string local_208;
  undefined1 local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  undefined1 local_1ba;
  allocator<char> local_1b9;
  string local_1b8;
  undefined1 local_192;
  allocator<char> local_191;
  string local_190;
  ShaderSource local_170;
  allocator<char> local_141;
  string local_140;
  ShaderSource local_120;
  ProgramSources local_e8;
  long local_18;
  Functions *gl;
  RenderPerformanceTestBase *this_local;
  
  gl = (Functions *)this;
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar3);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_192 = 1;
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_141);
  glu::VertexSource::VertexSource((VertexSource *)&local_120,&local_140);
  pPVar6 = glu::ProgramSources::operator<<(&local_e8,&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,
             "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nin mediump vec4 v_color;\nvoid main (void)\n{\n\tdEQP_FragColor = v_color;\n}\n"
             ,&local_191);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_170,&local_190);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_170);
  glu::ShaderProgram::ShaderProgram(this_00,pRVar5,pPVar6);
  local_192 = 0;
  this->m_renderProgram = this_00;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  glu::VertexSource::~VertexSource((VertexSource *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  glu::ProgramSources::~ProgramSources(&local_e8);
  bVar2 = glu::ShaderProgram::isOk(this->m_renderProgram);
  if (!bVar2) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(log,this->m_renderProgram);
    local_1ba = 1;
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"could not build program",&local_1b9);
    tcu::TestError::TestError(pTVar7,&local_1b8);
    local_1ba = 0;
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(local_18 + 0x780);
  dVar4 = glu::ShaderProgram::getProgram(this->m_renderProgram);
  iVar3 = (*pcVar1)(dVar4,"a_color");
  this->m_colorLoc = iVar3;
  pcVar1 = *(code **)(local_18 + 0x780);
  dVar4 = glu::ShaderProgram::getProgram(this->m_renderProgram);
  iVar3 = (*pcVar1)(dVar4,"a_position");
  this->m_positionLoc = iVar3;
  if (this->m_colorLoc == -1) {
    local_1e2 = 1;
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"Location of attribute a_color was -1",&local_1e1);
    tcu::TestError::TestError(pTVar7,&local_1e0);
    local_1e2 = 0;
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (this->m_positionLoc == -1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Location of attribute a_position was -1",&local_209);
    tcu::TestError::TestError(pTVar7,&local_208);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return (int)this;
}

Assistant:

void RenderPerformanceTestBase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_renderProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_colorVertexShader) << glu::FragmentSource(s_colorFragmentShader));
	if (!m_renderProgram->isOk())
	{
		m_testCtx.getLog() << *m_renderProgram;
		throw tcu::TestError("could not build program");
	}

	m_colorLoc = gl.getAttribLocation(m_renderProgram->getProgram(), "a_color");
	m_positionLoc = gl.getAttribLocation(m_renderProgram->getProgram(), "a_position");

	if (m_colorLoc == -1)
		throw tcu::TestError("Location of attribute a_color was -1");
	if (m_positionLoc == -1)
		throw tcu::TestError("Location of attribute a_position was -1");
}